

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCompose.c
# Opt level: O0

DdNode * cuddAddComposeRecur(DdManager *dd,DdNode *f,DdNode *g,DdNode *proj)

{
  uint uVar1;
  DdNode *pDVar2;
  DdNode *E;
  uint local_80;
  uint local_7c;
  DdHalfWord local_78;
  uint topindex;
  uint topg;
  uint topf;
  uint v;
  DdNode *e;
  DdNode *t;
  DdNode *r;
  DdNode *g0;
  DdNode *g1;
  DdNode *f0;
  DdNode *f1;
  DdNode *proj_local;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  uVar1 = dd->perm[proj->index];
  if (f->index == 0x7fffffff) {
    local_7c = f->index;
  }
  else {
    local_7c = dd->perm[f->index];
  }
  if (uVar1 < local_7c) {
    return f;
  }
  pDVar2 = cuddCacheLookup(dd,0x42,f,g,proj);
  if (pDVar2 != (DdNode *)0x0) {
    return pDVar2;
  }
  if (local_7c == uVar1) {
    t = cuddAddIteRecur(dd,g,(f->type).kids.T,(f->type).kids.E);
    if (t == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
  }
  else {
    if (g->index == 0x7fffffff) {
      local_80 = g->index;
    }
    else {
      local_80 = dd->perm[g->index];
    }
    if (local_80 < local_7c) {
      local_78 = g->index;
      g1 = f;
      f0 = f;
    }
    else {
      local_78 = f->index;
      f0 = (f->type).kids.T;
      g1 = (f->type).kids.E;
    }
    r = g;
    g0 = g;
    if (local_80 <= local_7c) {
      g0 = (g->type).kids.T;
      r = (g->type).kids.E;
    }
    pDVar2 = cuddAddComposeRecur(dd,f0,g0,proj);
    if (pDVar2 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + 1;
    E = cuddAddComposeRecur(dd,g1,r,proj);
    if (E == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar2);
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
    t = pDVar2;
    if ((pDVar2 != E) && (t = cuddUniqueInter(dd,local_78,pDVar2,E), t == (DdNode *)0x0)) {
      Cudd_RecursiveDeref(dd,pDVar2);
      Cudd_RecursiveDeref(dd,E);
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4) + -1;
    *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
  }
  cuddCacheInsert(dd,0x42,f,g,proj,t);
  return t;
}

Assistant:

DdNode *
cuddAddComposeRecur(
  DdManager * dd,
  DdNode * f,
  DdNode * g,
  DdNode * proj)
{
    DdNode *f1, *f0, *g1, *g0, *r, *t, *e;
    unsigned int v, topf, topg, topindex;

    statLine(dd);
    v = dd->perm[proj->index];
    topf = cuddI(dd,f->index);

    /* Terminal case. Subsumes the test for constant f. */
    if (topf > v) return(f);

    /* Check cache. */
    r = cuddCacheLookup(dd,DD_ADD_COMPOSE_RECUR_TAG,f,g,proj);
    if (r != NULL) {
        return(r);
    }

    if (topf == v) {
        /* Compose. */
        f1 = cuddT(f);
        f0 = cuddE(f);
        r = cuddAddIteRecur(dd, g, f1, f0);
        if (r == NULL) return(NULL);
    } else {
        /* Compute cofactors of f and g. Remember the index of the top
        ** variable.
        */
        topg = cuddI(dd,g->index);
        if (topf > topg) {
            topindex = g->index;
            f1 = f0 = f;
        } else {
            topindex = f->index;
            f1 = cuddT(f);
            f0 = cuddE(f);
        }
        if (topg > topf) {
            g1 = g0 = g;
        } else {
            g1 = cuddT(g);
            g0 = cuddE(g);
        }
        /* Recursive step. */
        t = cuddAddComposeRecur(dd, f1, g1, proj);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddAddComposeRecur(dd, f0, g0, proj);
        if (e == NULL) {
            Cudd_RecursiveDeref(dd, t);
            return(NULL);
        }
        cuddRef(e);

        if (t == e) {
            r = t;
        } else {
            r = cuddUniqueInter(dd, (int) topindex, t, e);
            if (r == NULL) {
                Cudd_RecursiveDeref(dd, t);
                Cudd_RecursiveDeref(dd, e);
                return(NULL);
            }
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert(dd,DD_ADD_COMPOSE_RECUR_TAG,f,g,proj,r);

    return(r);

}